

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O1

fdb_status
fdb_iterator_seek_byseq
          (fdb_iterator *iterator,fdb_seqnum_t seqnum,fdb_iterator_seek_opt_t seek_pref)

{
  ushort uVar1;
  fdb_kvs_handle *pfVar2;
  fdb_kvs_id_t fVar3;
  hbtrie_iterator *phVar4;
  hbtrie *trie;
  btree_iterator *pbVar5;
  btree *btree;
  kvs_info *pkVar6;
  wal_iterator *wal_itr;
  long lVar7;
  fdb_status fVar8;
  wal_item *pwVar9;
  uint64_t uVar10;
  ulong chunksize;
  undefined1 *buf;
  undefined8 uStack_100;
  undefined1 local_f8 [8];
  wal_item query;
  ulong local_38;
  fdb_seqnum_t _seq;
  
  fVar8 = FDB_RESULT_INVALID_HANDLE;
  if (iterator != (fdb_iterator *)0x0) {
    pfVar2 = iterator->handle;
    if (((pfVar2 != (fdb_kvs_handle *)0x0) &&
        (fVar8 = FDB_RESULT_INVALID_ARGS, seqnum != 0xffffffffffffffff)) &&
       (iterator->_key == (void *)0x0)) {
      iterator->direction = '\0';
      iterator->status = '\0';
      iterator->_seqnum = seqnum;
      uVar1 = (pfVar2->config).chunksize;
      chunksize = (ulong)uVar1;
      lVar7 = -(ulong)(uVar1 + 0x17 & 0xfffffff0);
      buf = local_f8 + lVar7;
      local_38 = seqnum >> 0x38 | (seqnum & 0xff000000000000) >> 0x28 |
                 (seqnum & 0xff0000000000) >> 0x18 | (seqnum & 0xff00000000) >> 8 |
                 (seqnum & 0xff000000) << 8 | (seqnum & 0xff0000) << 0x18 |
                 (seqnum & 0xff00) << 0x28 | seqnum << 0x38;
      if (pfVar2->kvs == (kvs_info *)0x0) {
        pbVar5 = iterator->seqtree_iterator;
        *(undefined8 *)((long)&uStack_100 + lVar7) = 0x1309a0;
        btree_iterator_free(pbVar5);
        pbVar5 = iterator->seqtree_iterator;
        btree = (iterator->handle->field_6).seqtree;
        *(undefined8 *)((long)&uStack_100 + lVar7) = 0x1309b4;
        btree_iterator_init(btree,pbVar5,&local_38);
      }
      else {
        fVar3 = pfVar2->kvs->id;
        *(undefined8 *)((long)&uStack_100 + lVar7) = 0x13096b;
        kvid2buf(chunksize,fVar3,buf);
        *(ulong *)(buf + chunksize) = local_38;
        phVar4 = iterator->seqtrie_iterator;
        *(undefined8 *)((long)&uStack_100 + lVar7) = 0x13097d;
        hbtrie_iterator_free(phVar4);
        phVar4 = iterator->seqtrie_iterator;
        trie = (iterator->handle->field_6).seqtrie;
        *(undefined8 *)((long)&uStack_100 + lVar7) = 0x130995;
        hbtrie_iterator_init(trie,phVar4,buf,0x10);
      }
      pkVar6 = iterator->handle->kvs;
      if (pkVar6 != (kvs_info *)0x0) {
        fVar3 = pkVar6->id;
        *(undefined8 *)((long)&uStack_100 + lVar7) = 0x1309d3;
        kvid2buf(chunksize,fVar3,buf);
        *(ulong *)(buf + chunksize) = local_38;
      }
      query.avl_seq.right = (avl_node *)((long)&query.field_12 + 0x10);
      wal_itr = iterator->wal_itr;
      query.offset = seqnum;
      *(undefined8 *)((long)&uStack_100 + lVar7) = 0x130a0c;
      pwVar9 = wal_itr_search_greater(wal_itr,(wal_item *)local_f8);
      iterator->tree_cursor = pwVar9;
      if (pwVar9 == (wal_item *)0x0) {
        uVar10 = 0xffffffffffffffff;
      }
      else {
        uVar10 = pwVar9->offset;
      }
      iterator->_offset = uVar10;
      iterator->tree_cursor_prev = pwVar9;
      if (seek_pref == '\0') {
        *(undefined8 *)((long)&uStack_100 + lVar7) = 0x130a48;
        fVar8 = fdb_iterator_next(iterator);
      }
      else {
        iterator->status = '\x01';
        *(undefined8 *)((long)&uStack_100 + lVar7) = 0x130a3e;
        fVar8 = fdb_iterator_prev(iterator);
      }
    }
  }
  return fVar8;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_seek_byseq(fdb_iterator* iterator,
                                   const fdb_seqnum_t seqnum,
                                   const fdb_iterator_seek_opt_t seek_pref)
{
    if (!iterator || !iterator->handle) return FDB_RESULT_INVALID_HANDLE;
    if (iterator->_key || seqnum == SEQNUM_NOT_USED) return FDB_RESULT_INVALID_ARGS;

    iterator->direction = FDB_ITR_DIR_NONE;
    iterator->status = FDB_ITR_IDX;
    iterator->_seqnum = seqnum;

    size_t size_seq = sizeof(fdb_seqnum_t);
    size_t size_chunk = iterator->handle->config.chunksize;
    uint8_t *end_seq_kv = alca(uint8_t, size_chunk + size_seq);
    fdb_seqnum_t _seq = _endian_encode(seqnum);
    if (iterator->handle->kvs) {
        // create an iterator handle for hb-trie
        kvid2buf(size_chunk, iterator->handle->kvs->id, end_seq_kv);
        memcpy(end_seq_kv + size_chunk, &_seq, size_seq);

        // reset HB+trie's seqtrie iterator using end_seq_kv
        hbtrie_iterator_free(iterator->seqtrie_iterator);
        hbtrie_iterator_init(iterator->handle->seqtrie,
                             iterator->seqtrie_iterator,
                             end_seq_kv, sizeof(size_t)*2);
    } else {
        // reset Btree iterator to end_seqnum
        btree_iterator_free(iterator->seqtree_iterator);
        // create an iterator handle for b-tree
        btree_iterator_init(iterator->handle->seqtree,
                            iterator->seqtree_iterator,
                            (void *)&_seq);
    }

    struct wal_item query;
    struct wal_item_header query_key;
    if (iterator->handle->kvs) {
        query_key.key = end_seq_kv;
        kvid2buf(size_chunk, iterator->handle->kvs->id, end_seq_kv);
        memcpy(end_seq_kv + size_chunk, &_seq, size_seq);
        query_key.keylen = size_chunk + size_seq;
    } else {
        query_key.key = (void *) NULL;
        query_key.keylen = 0;
    }
    query.header = &query_key;
    query.seqnum = seqnum;

    // reset WAL tree cursor using search because of the sharded WAL
    iterator->tree_cursor = wal_itr_search_greater(iterator->wal_itr, &query);

    if (iterator->tree_cursor) {
        // If WAL tree has an entry, skip Main index for reverse iteration..
        iterator->_offset = iterator->tree_cursor->offset;
    } else {
        iterator->_offset = BLK_NOT_FOUND; // fetch from main index
    }

    iterator->tree_cursor_prev = iterator->tree_cursor;
    if (seek_pref == FDB_ITR_SEEK_HIGHER) {
        return fdb_iterator_next(iterator);
    } else {
        iterator->status = FDB_ITR_WAL;
        return fdb_iterator_prev(iterator);
    }
}